

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

parser_error parse_ghost_spells_off(parser *p)

{
  errr eVar1;
  void *pvVar2;
  char *pcVar3;
  parser_error local_34;
  char *pcStack_30;
  wchar_t ret;
  char *s;
  char *flags;
  ghost_level *l;
  ghost *g;
  parser *p_local;
  
  pvVar2 = parser_priv(p);
  local_34 = PARSE_ERROR_NONE;
  if (pvVar2 == (void *)0x0) {
    __assert_fail("g",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-init.c"
                  ,0x87e,"enum parser_error parse_ghost_spells_off(struct parser *)");
  }
  for (flags = *(char **)((long)pvVar2 + 0x18); *(long *)flags != 0; flags = *(char **)flags) {
  }
  pcVar3 = parser_getstr(p,"spells");
  pcVar3 = string_make(pcVar3);
  pcStack_30 = strtok(pcVar3," |");
  do {
    if (pcStack_30 == (char *)0x0) {
LAB_0019dd45:
      mem_free(pcVar3);
      return local_34;
    }
    eVar1 = grab_flag((bitflag *)(flags + 0x6d),0xd,r_info_spell_flags,pcStack_30);
    if (eVar1 != 0) {
      quit_fmt("bad spell flag: %s",pcStack_30);
      local_34 = PARSE_ERROR_INVALID_FLAG;
      goto LAB_0019dd45;
    }
    pcStack_30 = strtok((char *)0x0," |");
  } while( true );
}

Assistant:

static enum parser_error parse_ghost_spells_off(struct parser *p) {
	struct ghost *g = parser_priv(p);
	struct ghost_level *l;
	char *flags;
	char *s;
	int ret = PARSE_ERROR_NONE;
	assert(g);
	l = g->level;
	while (l->next) {
		l = l->next;
	}

	flags = string_make(parser_getstr(p, "spells"));
	s = strtok(flags, " |");
	while (s) {
		if (grab_flag(l->spell_flags_off, RSF_SIZE, r_info_spell_flags, s)) {
			quit_fmt("bad spell flag: %s", s);
			ret = PARSE_ERROR_INVALID_FLAG;
			break;
		}
		s = strtok(NULL, " |");
	}

	mem_free(flags);
	return ret;
}